

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

void nativeIo_destroy(PHYSFS_Io *io)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)io->opaque;
  __PHYSFS_platformClose((void *)*puVar1);
  (*__PHYSFS_AllocatorHooks.Free)((void *)puVar1[1]);
  (*__PHYSFS_AllocatorHooks.Free)(puVar1);
  (*__PHYSFS_AllocatorHooks.Free)(io);
  return;
}

Assistant:

static void nativeIo_destroy(PHYSFS_Io *io)
{
    NativeIoInfo *info = (NativeIoInfo *) io->opaque;
    __PHYSFS_platformClose(info->handle);
    allocator.Free((void *) info->path);
    allocator.Free(info);
    allocator.Free(io);
}